

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  short *psVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t in_len;
  uint32_t out_len;
  uint local_38;
  uint local_34;
  
  uVar2 = (ulong)(this->super_processor).channels;
  if ((this->resampling_out_buffer).capacity_ < uVar2 * output_frame_count) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar2 * output_frame_count);
    uVar2 = (ulong)(this->super_processor).channels;
  }
  local_38 = (uint)((this->resampling_in_buffer).length_ / uVar2);
  local_34 = (uint)output_frame_count;
  speex_resample(this,(this->resampling_in_buffer).data_,&local_38,
                 (this->resampling_out_buffer).data_,&local_34);
  if (local_34 < output_frame_count) {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (1 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: underrun during resampling: got %u frames, expected %zu\n",
                 "cubeb_resampler_internal.h",0xf9,(ulong)local_34,output_frame_count);
    }
    psVar1 = (this->resampling_out_buffer).data_;
    uVar3 = (this->super_processor).channels;
    uVar2 = (ulong)uVar3;
    for (uVar3 = local_34 * uVar3; uVar4 = (ulong)uVar3,
        uVar4 <= output_frame_count * uVar2 && output_frame_count * uVar2 - uVar4 != 0;
        uVar3 = uVar3 + 1) {
      psVar1[uVar4] = 0;
    }
  }
  else {
    uVar2 = (ulong)(this->super_processor).channels;
  }
  auto_array<short>::pop(&this->resampling_in_buffer,(short *)0x0,local_38 * uVar2);
  *input_frames_used = (ulong)local_38;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() <
        frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu",
           (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T * data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len);
           i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }